

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformservices.cpp
# Opt level: O2

bool __thiscall QPlatformServices::openDocument(QPlatformServices *this,QUrl *url)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_68;
  QArrayDataPointer<char> local_50;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38[0] = '\x02';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_20 = "default";
  QUrl::toString(&QStack_68,url,0);
  QString::toLocal8Bit((QByteArray *)&local_50,(QString *)&QStack_68);
  if (local_50.ptr == (char *)0x0) {
    local_50.ptr = (char *)&QByteArray::_empty;
  }
  QMessageLogger::warning
            (local_38,"This plugin does not support QPlatformServices::openDocument() for \'%s\'.",
             local_50.ptr);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool QPlatformServices::openDocument(const QUrl &url)
{
    qWarning("This plugin does not support QPlatformServices::openDocument() for '%s'.",
             qPrintable(url.toString()));
    return false;
}